

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P2R.cpp
# Opt level: O2

void __thiscall OpenMD::P2Z::process(P2Z *this)

{
  SelectionManager *this_00;
  int *piVar1;
  char cVar2;
  SimInfo *info;
  int iVar3;
  int iVar4;
  StuntDouble *pSVar5;
  StuntDouble *pSVar6;
  uint whichFrame;
  double dVar7;
  int ii;
  int jj;
  Vector3d zhat;
  Vector3d r1;
  Vector3d vec;
  Vector3d r2;
  DumpReader reader;
  int local_1388;
  uint local_1384;
  SelectionManager *local_1380;
  int local_1378;
  int local_1374;
  SelectionEvaluator *local_1370;
  SelectionEvaluator *local_1368;
  Vector<double,_3U> local_1360;
  RectMatrix<double,_3U,_3U> local_1348;
  Vector<double,_3U> local_1300;
  Vector<double,_3U> local_12e8;
  RotMat3x3d local_12d0;
  DumpReader local_1288;
  
  Vector<double,_3U>::Vector(&local_1360,(Vector<double,_3U> *)OpenMD::V3Zero);
  local_1360.data_[*(uint *)&(this->super_P2R).field_0xd64] = 1.0;
  info = (this->super_P2R).super_StaticAnalyser.info_;
  cVar2 = (info->simParams_->UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b;
  DumpReader::DumpReader(&local_1288,info,&(this->super_P2R).super_StaticAnalyser.dumpFilename_);
  local_1378 = DumpReader::getNFrames(&local_1288);
  (this->super_P2R).nProcessed_ = local_1378 / (this->super_P2R).super_StaticAnalyser.step_;
  (this->super_P2R).P2_ = 0.0;
  (this->super_P2R).count_ = 0;
  local_1368 = &(this->super_P2R).evaluator1_;
  this_00 = &(this->super_P2R).seleMan1_;
  local_1370 = &(this->super_P2R).evaluator2_;
  local_1380 = &(this->super_P2R).seleMan2_;
  whichFrame = 0;
  while ((int)whichFrame < local_1378) {
    local_1384 = whichFrame;
    DumpReader::readFrame(&local_1288,whichFrame);
    (this->super_P2R).currentSnapshot_ =
         ((this->super_P2R).super_StaticAnalyser.info_)->sman_->currentSnapshot_;
    if ((this->super_P2R).evaluator1_.isDynamic_ == true) {
      SelectionEvaluator::evaluate((SelectionSet *)&local_1348,local_1368);
      SelectionManager::setSelectionSet(this_00,(SelectionSet *)&local_1348);
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_1348)
      ;
    }
    if ((this->super_P2R).doVect_ == true) {
      pSVar5 = SelectionManager::beginSelected(this_00,&local_1388);
      while (pSVar5 != (StuntDouble *)0x0) {
        if (pSVar5->objType_ - otDAtom < 2) {
          StuntDouble::getA(&local_12d0,pSVar5);
          SquareMatrix3<double>::transpose((SquareMatrix3<double> *)&local_1348,&local_12d0);
          operator*(&local_1300,&local_1348,(Vector<double,_3U> *)OpenMD::V3Z);
          Vector<double,_3U>::Vector(&local_12e8,&local_1300);
          Vector<double,_3U>::normalize(&local_12e8);
          dVar7 = dot<double,3u>(&local_1360,&local_12e8);
          (this->super_P2R).P2_ = (dVar7 * 3.0 * dVar7 + -1.0) * 0.5 + (this->super_P2R).P2_;
          piVar1 = &(this->super_P2R).count_;
          *piVar1 = *piVar1 + 1;
        }
        pSVar5 = SelectionManager::nextSelected(this_00,&local_1388);
      }
    }
    else if ((this->super_P2R).doOffset_ == true) {
      pSVar5 = SelectionManager::beginSelected(this_00,&local_1388);
      while (pSVar5 != (StuntDouble *)0x0) {
        Vector<double,_3U>::Vector((Vector<double,_3U> *)&local_1348);
        if ((this->super_P2R).doOffset2_ == true) {
          pSVar6 = SimInfo::getIOIndexToIntegrableObject
                             ((this->super_P2R).super_StaticAnalyser.info_,
                              (this->super_P2R).seleOffset2_ + pSVar5->globalIndex_);
          StuntDouble::getPos((Vector3d *)&local_12d0,pSVar6);
          Vector<double,_3U>::operator=
                    ((Vector<double,_3U> *)&local_1348,(Vector<double,_3U> *)&local_12d0);
        }
        else {
          StuntDouble::getPos((Vector3d *)&local_12d0,pSVar5);
          Vector<double,_3U>::operator=
                    ((Vector<double,_3U> *)&local_1348,(Vector<double,_3U> *)&local_12d0);
        }
        pSVar5 = SimInfo::getIOIndexToIntegrableObject
                           ((this->super_P2R).super_StaticAnalyser.info_,
                            (this->super_P2R).seleOffset_ + pSVar5->globalIndex_);
        StuntDouble::getPos((Vector3d *)&local_12d0,pSVar5);
        operator-(&local_1300,(Vector<double,_3U> *)&local_1348,(Vector<double,_3U> *)&local_12d0);
        Vector<double,_3U>::Vector(&local_12e8,&local_1300);
        if (cVar2 != '\0') {
          Snapshot::wrapVector((this->super_P2R).currentSnapshot_,(Vector3d *)&local_12e8);
        }
        Vector<double,_3U>::normalize(&local_12e8);
        dVar7 = dot<double,3u>(&local_1360,&local_12e8);
        (this->super_P2R).P2_ = (dVar7 * 3.0 * dVar7 + -1.0) * 0.5 + (this->super_P2R).P2_;
        piVar1 = &(this->super_P2R).count_;
        *piVar1 = *piVar1 + 1;
        pSVar5 = SelectionManager::nextSelected(this_00,&local_1388);
      }
    }
    else {
      if ((this->super_P2R).evaluator2_.isDynamic_ == true) {
        SelectionEvaluator::evaluate((SelectionSet *)&local_1348,local_1370);
        SelectionManager::setSelectionSet(local_1380,(SelectionSet *)&local_1348);
        std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                  ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)
                   &local_1348);
      }
      iVar3 = SelectionManager::getSelectionCount(this_00);
      iVar4 = SelectionManager::getSelectionCount(local_1380);
      if (iVar3 != iVar4) {
        snprintf(painCave.errMsg,2000,
                 "In frame %d, the number of selected StuntDoubles are\n\tnot the same in --sele1 and sele2\n"
                 ,(ulong)local_1384);
        painCave.isFatal = 0;
        painCave.severity = 3;
        simError();
      }
      pSVar5 = SelectionManager::beginSelected(this_00,&local_1388);
      pSVar6 = SelectionManager::beginSelected(local_1380,&local_1374);
      while ((pSVar6 != (StuntDouble *)0x0 && (pSVar5 != (StuntDouble *)0x0))) {
        StuntDouble::getPos((Vector3d *)&local_1348,pSVar5);
        StuntDouble::getPos((Vector3d *)&local_12d0,pSVar6);
        operator-(&local_1300,(Vector<double,_3U> *)&local_1348,(Vector<double,_3U> *)&local_12d0);
        Vector<double,_3U>::Vector(&local_12e8,&local_1300);
        if (cVar2 != '\0') {
          Snapshot::wrapVector((this->super_P2R).currentSnapshot_,(Vector3d *)&local_12e8);
        }
        Vector<double,_3U>::normalize(&local_12e8);
        dVar7 = dot<double,3u>(&local_1360,&local_12e8);
        (this->super_P2R).P2_ = (dVar7 * 3.0 * dVar7 + -1.0) * 0.5 + (this->super_P2R).P2_;
        piVar1 = &(this->super_P2R).count_;
        *piVar1 = *piVar1 + 1;
        pSVar5 = SelectionManager::nextSelected(this_00,&local_1388);
        pSVar6 = SelectionManager::nextSelected(local_1380,&local_1374);
      }
    }
    whichFrame = local_1384 + (this->super_P2R).super_StaticAnalyser.step_;
  }
  iVar3 = (this->super_P2R).count_;
  if (0 < iVar3) {
    (this->super_P2R).P2_ = (this->super_P2R).P2_ / (double)iVar3;
  }
  P2R::writeP2R(&this->super_P2R);
  DumpReader::~DumpReader(&local_1288);
  return;
}

Assistant:

void P2Z::process() {
    Vector3d zhat = V3Zero;
    zhat[axis_]   = 1.0;  // unit vector along preferred axis

    StuntDouble* sd1;
    StuntDouble* sd2;
    int ii;
    int jj;
    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    DumpReader reader(info_, dumpFilename_);
    int nFrames = reader.getNFrames();

    nProcessed_ = nFrames / step_;
    P2_         = 0.0;
    count_      = 0;

    for (int istep = 0; istep < nFrames; istep += step_) {
      reader.readFrame(istep);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      if (evaluator1_.isDynamic()) {
        seleMan1_.setSelectionSet(evaluator1_.evaluate());
      }

      if (doVect_) {
        for (sd1 = seleMan1_.beginSelected(ii); sd1 != NULL;
             sd1 = seleMan1_.nextSelected(ii)) {
          // only do this if the stunt double actually has a vector associated
          // with it
          if (sd1->isDirectional()) {
            Vector3d vec = sd1->getA().transpose() * V3Z;
            vec.normalize();
            RealType cosangle = dot(zhat, vec);

            P2_ += 0.5 * (3.0 * cosangle * cosangle - 1.0);
            count_++;
          }
        }
      } else {
        if (doOffset_) {
          for (sd1 = seleMan1_.beginSelected(ii); sd1 != NULL;
               sd1 = seleMan1_.nextSelected(ii)) {
            // This will require careful rewriting if StaticProps is
            // ever parallelized.  For an example, see
            // Thermo::getTaggedAtomPairDistance
            Vector3d r1;

            if (doOffset2_) {
              int sd1Aind       = sd1->getGlobalIndex() + seleOffset2_;
              StuntDouble* sd1A = info_->getIOIndexToIntegrableObject(sd1Aind);
              r1                = sd1A->getPos();
            } else {
              r1 = sd1->getPos();
            }

            int sd2Index = sd1->getGlobalIndex() + seleOffset_;
            sd2          = info_->getIOIndexToIntegrableObject(sd2Index);

            Vector3d r2  = sd2->getPos();
            Vector3d vec = r1 - r2;

            if (usePeriodicBoundaryConditions_)
              currentSnapshot_->wrapVector(vec);

            vec.normalize();
            RealType cosangle = dot(zhat, vec);
            P2_ += 0.5 * (3.0 * cosangle * cosangle - 1.0);
            count_++;
          }
        } else {
          if (evaluator2_.isDynamic()) {
            seleMan2_.setSelectionSet(evaluator2_.evaluate());
          }

          if (seleMan1_.getSelectionCount() != seleMan2_.getSelectionCount()) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "In frame %d, the number of selected StuntDoubles are\n"
                     "\tnot the same in --sele1 and sele2\n",
                     istep);
            painCave.severity = OPENMD_INFO;
            painCave.isFatal  = 0;
            simError();
          }

          for (sd1                             = seleMan1_.beginSelected(ii),
              sd2                              = seleMan2_.beginSelected(jj);
               sd1 != NULL && sd2 != NULL; sd1 = seleMan1_.nextSelected(ii),
              sd2                              = seleMan2_.nextSelected(jj)) {
            Vector3d r1  = sd1->getPos();
            Vector3d r2  = sd2->getPos();
            Vector3d vec = r1 - r2;

            if (usePeriodicBoundaryConditions_)
              currentSnapshot_->wrapVector(vec);

            vec.normalize();
            RealType cosangle = dot(zhat, vec);
            P2_ += 0.5 * (3.0 * cosangle * cosangle - 1.0);
            count_++;
          }
        }
      }
    }
    processHistogram();
    writeP2R();
  }